

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O3

void __thiscall
OpenSteer::drawCameraLookAt(OpenSteer *this,Vec3 *cameraPosition,Vec3 *pointToLookAt,Vec3 *up_)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar22;
  float local_58;
  float local_54;
  float local_50;
  undefined4 local_4c;
  float local_48;
  float local_44;
  float local_40;
  undefined4 local_3c;
  float local_38;
  float local_34;
  float local_30;
  undefined1 local_2c [16];
  undefined4 local_1c;
  float fVar21;
  
  fVar13 = cameraPosition->z - *(float *)(this + 8);
  uVar1 = cameraPosition->x;
  uVar5 = cameraPosition->y;
  fVar16 = (float)uVar1 - (float)*(undefined8 *)this;
  fVar18 = (float)uVar5 - (float)((ulong)*(undefined8 *)this >> 0x20);
  uVar2 = pointToLookAt->x;
  uVar6 = pointToLookAt->y;
  fVar15 = fVar13 * pointToLookAt->z + fVar16 * (float)uVar2 + fVar18 * (float)uVar6;
  iVar11 = -(uint)(Vec3::zero.x == fVar16 - fVar15 * (float)uVar2);
  iVar12 = -(uint)(Vec3::zero.y == fVar18 - fVar15 * (float)uVar6);
  auVar20._4_4_ = iVar11;
  auVar20._0_4_ = iVar11;
  auVar20._8_4_ = iVar12;
  auVar20._12_4_ = iVar12;
  uVar10 = movmskpd((int)up_,auVar20);
  if (((uVar10 & 1) != 0) && ((byte)((byte)uVar10 >> 1) != 0)) {
    fVar13 = fVar13 - pointToLookAt->z * fVar15;
    if ((fVar13 == Vec3::zero.z) && (!NAN(fVar13) && !NAN(Vec3::zero.z))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"OpenSteer - LookAt: degenerate camera",0x25);
    }
  }
  (*glad_glLoadIdentity)();
  uVar3 = cameraPosition->x;
  uVar7 = cameraPosition->y;
  fVar13 = cameraPosition->z - *(float *)(this + 8);
  auVar14._0_4_ = (float)uVar3 - (float)*(undefined8 *)this;
  auVar14._4_4_ = (float)uVar7 - (float)((ulong)*(undefined8 *)this >> 0x20);
  auVar14._8_8_ = 0;
  fVar15 = SQRT(fVar13 * fVar13 + auVar14._0_4_ * auVar14._0_4_ + auVar14._4_4_ * auVar14._4_4_);
  if (0.0 < fVar15) {
    auVar17._4_4_ = fVar15;
    auVar17._0_4_ = fVar15;
    auVar17._8_4_ = fVar15;
    auVar17._12_4_ = fVar15;
    auVar14 = divps(auVar14,auVar17);
  }
  fVar13 = (float)(~-(uint)(0.0 < fVar15) & (uint)fVar13 |
                  (uint)(fVar13 / fVar15) & -(uint)(0.0 < fVar15));
  fVar15 = auVar14._0_4_;
  fVar16 = auVar14._4_4_;
  uVar4 = pointToLookAt->y;
  uVar8 = pointToLookAt->z;
  local_30 = -fVar13;
  local_50 = -fVar15;
  fVar18 = (float)uVar8 * fVar16 - (float)uVar4 * fVar13;
  fVar21 = pointToLookAt->x * fVar13 - (float)uVar8 * fVar15;
  auVar19._0_8_ = CONCAT44(fVar21,fVar18);
  auVar19._8_4_ = (float)uVar8 * auVar14._8_4_ - auVar14._8_4_ * 0.0;
  auVar19._12_4_ = (float)uVar8 * auVar14._12_4_ - auVar14._12_4_ * 0.0;
  local_40 = -fVar16;
  fVar22 = (float)uVar4 * fVar15 - pointToLookAt->x * fVar16;
  fVar18 = SQRT(fVar22 * fVar22 + fVar18 * fVar18 + fVar21 * fVar21);
  if (0.0 < fVar18) {
    auVar9._4_4_ = fVar18;
    auVar9._0_4_ = fVar18;
    auVar9._8_4_ = fVar18;
    auVar9._12_4_ = fVar18;
    auVar20 = divps(auVar19,auVar9);
    auVar19._0_8_ = auVar20._0_8_;
  }
  local_38 = (float)(~-(uint)(0.0 < fVar18) & (uint)fVar22 |
                    (uint)(fVar22 / fVar18) & -(uint)(0.0 < fVar18));
  local_58 = (float)auVar19._0_8_;
  local_48 = (float)((ulong)auVar19._0_8_ >> 0x20);
  local_54 = local_48 * fVar13 - fVar16 * local_38;
  local_44 = local_38 * fVar15 - fVar13 * local_58;
  local_34 = local_58 * fVar16 - local_48 * fVar15;
  local_2c = (undefined1  [16])0x0;
  local_3c = 0;
  local_4c = 0;
  local_1c = 0x3f800000;
  (*glad_glLoadMatrixf)(&local_58);
  (*glad_glTranslatef)(-*(GLfloat *)this,-*(GLfloat *)(this + 4),-*(GLfloat *)(this + 8));
  return;
}

Assistant:

void 
OpenSteer::drawCameraLookAt (const Vec3& cameraPosition,
                             const Vec3& pointToLookAt,
                             const Vec3& up_)
{
    // check for valid "look at" parameters
    drawCameraLookAtCheck (cameraPosition, pointToLookAt, up_);

    glLoadIdentity();
    float matrix2[16];

    Vec3 forward = pointToLookAt - cameraPosition;
    forward = forward.normalize();
    Vec3 side;
    side.cross(forward, up_);
    side = side.normalize();
    Vec3 up;
    up.cross(side, forward);

    matrix2[0] = side.x;
    matrix2[4] = side.y;
    matrix2[8] = side.z;
    matrix2[12] = 0.f;
    matrix2[1] = up.x;
    matrix2[5] = up.y;
    matrix2[9] = up.z;
    matrix2[13] = 0.f;
    matrix2[2] = -forward.x;
    matrix2[6] = -forward.y;
    matrix2[10] = -forward.z;
    matrix2[14] = 0.f;
    matrix2[3] = matrix2[7] = matrix2[11] = 0.f;
    matrix2[15] = 1.f;

    glLoadMatrixf(matrix2);
    glTranslatef(-cameraPosition.x, -cameraPosition.y, -cameraPosition.z);
}